

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_submit.c
# Opt level: O2

int nghttp2_submit_altsvc
              (nghttp2_session *session,uint8_t flags,int32_t stream_id,uint8_t *origin,
              size_t origin_len,uint8_t *field_value,size_t field_value_len)

{
  nghttp2_mem *mem;
  int iVar1;
  uint8_t *dest;
  uint8_t *puVar2;
  uint8_t *puVar3;
  nghttp2_outbound_item *item;
  size_t size;
  
  if (session->server == '\0') {
    iVar1 = -0x207;
  }
  else {
    size = origin_len + field_value_len + 2;
    iVar1 = -0x1f5;
    if (size < 0x4001) {
      if (stream_id == 0) {
        if (origin_len == 0) {
          return -0x1f5;
        }
      }
      else if (origin_len != 0) {
        return -0x1f5;
      }
      mem = &session->mem;
      dest = (uint8_t *)nghttp2_mem_malloc(mem,size);
      iVar1 = -0x385;
      if (dest != (uint8_t *)0x0) {
        puVar2 = dest;
        if (origin_len != 0) {
          puVar2 = nghttp2_cpymem(dest,origin,origin_len);
        }
        *puVar2 = '\0';
        puVar2 = puVar2 + 1;
        puVar3 = puVar2;
        if (field_value_len != 0) {
          puVar3 = nghttp2_cpymem(puVar2,field_value,field_value_len);
        }
        *puVar3 = '\0';
        item = (nghttp2_outbound_item *)nghttp2_mem_malloc(mem,0x98);
        if (item == (nghttp2_outbound_item *)0x0) {
          free(dest);
        }
        else {
          nghttp2_outbound_item_init(item);
          (item->aux_data).goaway.flags = '\x01';
          (item->frame).ext.payload = &item->ext_frame_payload;
          nghttp2_frame_altsvc_init
                    ((nghttp2_extension *)item,stream_id,dest,origin_len,puVar2,field_value_len);
          iVar1 = nghttp2_session_add_item(session,item);
          if (iVar1 == 0) {
            iVar1 = 0;
          }
          else {
            nghttp2_frame_altsvc_free((nghttp2_extension *)item,mem);
            nghttp2_mem_free(mem,item);
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int nghttp2_submit_altsvc(nghttp2_session *session, uint8_t flags,
                          int32_t stream_id, const uint8_t *origin,
                          size_t origin_len, const uint8_t *field_value,
                          size_t field_value_len) {
  nghttp2_mem *mem;
  uint8_t *buf, *p;
  uint8_t *origin_copy;
  uint8_t *field_value_copy;
  nghttp2_outbound_item *item;
  nghttp2_frame *frame;
  nghttp2_ext_altsvc *altsvc;
  int rv;
  (void)flags;

  mem = &session->mem;

  if (!session->server) {
    return NGHTTP2_ERR_INVALID_STATE;
  }

  if (2 + origin_len + field_value_len > NGHTTP2_MAX_PAYLOADLEN) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  if (stream_id == 0) {
    if (origin_len == 0) {
      return NGHTTP2_ERR_INVALID_ARGUMENT;
    }
  } else if (origin_len != 0) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  buf = nghttp2_mem_malloc(mem, origin_len + field_value_len + 2);
  if (buf == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  p = buf;

  origin_copy = p;
  if (origin_len) {
    p = nghttp2_cpymem(p, origin, origin_len);
  }
  *p++ = '\0';

  field_value_copy = p;
  if (field_value_len) {
    p = nghttp2_cpymem(p, field_value, field_value_len);
  }
  *p++ = '\0';

  item = nghttp2_mem_malloc(mem, sizeof(nghttp2_outbound_item));
  if (item == NULL) {
    rv = NGHTTP2_ERR_NOMEM;
    goto fail_item_malloc;
  }

  nghttp2_outbound_item_init(item);

  item->aux_data.ext.builtin = 1;

  altsvc = &item->ext_frame_payload.altsvc;

  frame = &item->frame;
  frame->ext.payload = altsvc;

  nghttp2_frame_altsvc_init(&frame->ext, stream_id, origin_copy, origin_len,
                            field_value_copy, field_value_len);

  rv = nghttp2_session_add_item(session, item);
  if (rv != 0) {
    nghttp2_frame_altsvc_free(&frame->ext, mem);
    nghttp2_mem_free(mem, item);

    return rv;
  }

  return 0;

fail_item_malloc:
  free(buf);

  return rv;
}